

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

bool embree::sse42::
     BVHNIntersector1<4,_1,_false,_embree::sse42::ArrayIntersector1<embree::sse42::ObjectIntersector1<false>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float fVar1;
  float fVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  undefined8 uVar4;
  Geometry *this;
  long lVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  undefined1 (*pauVar9) [16];
  byte bVar10;
  bool bVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  byte bVar15;
  undefined1 (*pauVar16) [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  float fVar29;
  float fVar32;
  float fVar33;
  undefined1 auVar30 [16];
  float fVar34;
  undefined1 auVar31 [16];
  float fVar35;
  float fVar37;
  float fVar38;
  float fVar39;
  undefined1 auVar36 [16];
  float fVar40;
  float fVar45;
  float fVar46;
  float fVar47;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined4 local_100c;
  float local_fe8 [4];
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  undefined8 local_fa8;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined1 local_f88 [16];
  ulong local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 == 8) {
    local_100c._0_1_ = false;
  }
  else {
    uStack_f70 = 0;
    fVar52 = (query->p).field_0.field_0.x;
    fVar1 = (query->p).field_0.field_0.y;
    fVar2 = (query->p).field_0.field_0.z;
    local_fb8 = (context->query_radius).field_0.m128[0];
    fStack_fc4 = *(float *)((long)&(context->query_radius).field_0 + 4);
    fStack_fd4 = *(float *)((long)&(context->query_radius).field_0 + 8);
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_f88 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      aVar3 = (context->query_radius).field_0;
      local_f88 = dpps((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
    }
    pauVar16 = (undefined1 (*) [16])local_f68;
    auVar51._4_4_ = fVar1;
    auVar51._0_4_ = fVar1;
    auVar51._8_4_ = fVar1;
    auVar51._12_4_ = fVar1;
    auVar50._4_4_ = fVar2;
    auVar50._0_4_ = fVar2;
    auVar50._8_4_ = fVar2;
    auVar50._12_4_ = fVar2;
    local_fc8 = fStack_fc4;
    fStack_fc0 = fStack_fc4;
    fStack_fbc = fStack_fc4;
    local_fd8 = fStack_fd4;
    fStack_fd0 = fStack_fd4;
    fStack_fcc = fStack_fd4;
    fVar24 = local_fb8 * local_fb8;
    local_100c = 0;
    local_f98 = fVar52;
    fStack_f94 = fVar52;
    fStack_f90 = fVar52;
    fStack_f8c = fVar52;
    uVar13 = local_f78;
    fVar25 = fVar24;
    fVar26 = fVar24;
    fVar27 = fVar24;
    fStack_fb4 = local_fb8;
    fStack_fb0 = local_fb8;
    fStack_fac = local_fb8;
    fVar53 = fVar52;
    fVar54 = fVar52;
    fVar55 = fVar52;
    do {
      local_fa8 = CONCAT44(fVar53 - fStack_fb4,fVar52 - local_fb8);
      fStack_fa0 = fVar54 - fStack_fb0;
      fStack_f9c = fVar55 - fStack_fac;
      local_fa8 = uVar13;
      while (pauVar9 = pauVar16 + -1, pauVar16 = pauVar16 + -1,
            *(float *)((long)*pauVar9 + 8) <= local_f88._0_4_) {
        uVar13 = *(ulong *)*pauVar16;
LAB_00da686b:
        if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
          if ((uVar13 & 8) != 0) goto LAB_00da6bde;
          auVar28 = *(undefined1 (*) [16])(uVar13 + 0x20);
          auVar31 = *(undefined1 (*) [16])(uVar13 + 0x30);
          auVar30._4_4_ = fVar53;
          auVar30._0_4_ = fVar52;
          auVar30._8_4_ = fVar54;
          auVar30._12_4_ = fVar55;
          auVar30 = maxps(auVar30,auVar28);
          auVar30 = minps(auVar30,auVar31);
          fVar29 = auVar30._0_4_ - fVar52;
          fVar32 = auVar30._4_4_ - fVar53;
          fVar33 = auVar30._8_4_ - fVar54;
          fVar34 = auVar30._12_4_ - fVar55;
          auVar30 = maxps(auVar51,*(undefined1 (*) [16])(uVar13 + 0x40));
          auVar30 = minps(auVar30,*(undefined1 (*) [16])(uVar13 + 0x50));
          fVar35 = auVar30._0_4_ - fVar1;
          fVar37 = auVar30._4_4_ - fVar1;
          fVar38 = auVar30._8_4_ - fVar1;
          fVar39 = auVar30._12_4_ - fVar1;
          auVar30 = maxps(auVar50,*(undefined1 (*) [16])(uVar13 + 0x60));
          auVar30 = minps(auVar30,*(undefined1 (*) [16])(uVar13 + 0x70));
          fVar40 = auVar30._0_4_ - fVar2;
          fVar45 = auVar30._4_4_ - fVar2;
          fVar46 = auVar30._8_4_ - fVar2;
          fVar47 = auVar30._12_4_ - fVar2;
          local_fe8[0] = fVar40 * fVar40 + fVar35 * fVar35 + fVar29 * fVar29;
          local_fe8[1] = fVar45 * fVar45 + fVar37 * fVar37 + fVar32 * fVar32;
          local_fe8[2] = fVar46 * fVar46 + fVar38 * fVar38 + fVar33 * fVar33;
          local_fe8[3] = fVar47 * fVar47 + fVar39 * fVar39 + fVar34 * fVar34;
          bVar7 = auVar28._0_4_ <= auVar31._0_4_ && local_fe8[0] <= fVar24;
          bVar8 = auVar28._4_4_ <= auVar31._4_4_ && local_fe8[1] <= fVar25;
          bVar6 = auVar28._8_4_ <= auVar31._8_4_ && local_fe8[2] <= fVar26;
          bVar11 = auVar28._12_4_ <= auVar31._12_4_ && local_fe8[3] <= fVar27;
        }
        else {
          if ((uVar13 & 8) != 0) {
LAB_00da6bde:
            local_fa8 = (ulong)((uint)uVar13 & 0xf) - 8;
            if (local_fa8 != 0) {
              uVar14 = 0;
              bVar10 = 0;
              do {
                bVar15 = bVar10;
                uVar12 = *(uint *)((uVar13 & 0xfffffffffffffff0) + uVar14 * 8);
                this = (context->scene->geometries).items[uVar12].ptr;
                context->geomID = uVar12;
                context->primID = *(uint *)((uVar13 & 0xfffffffffffffff0) + 4 + uVar14 * 8);
                bVar11 = Geometry::pointQuery(this,query,context);
                uVar14 = uVar14 + 1;
                bVar10 = bVar15 | bVar11;
              } while (local_fa8 != uVar14);
              fVar52 = local_f98;
              fVar53 = fStack_f94;
              fVar54 = fStack_f90;
              fVar55 = fStack_f8c;
              if (bVar15 != 0 || bVar11) {
                auVar28 = *(undefined1 (*) [16])(context->query_radius).field_0.m128;
                local_fb8 = auVar28._0_4_;
                fStack_fc4 = auVar28._4_4_;
                fStack_fd4 = auVar28._8_4_;
                local_fc8 = fStack_fc4;
                fStack_fc0 = fStack_fc4;
                fStack_fbc = fStack_fc4;
                local_fd8 = fStack_fd4;
                fStack_fd0 = fStack_fd4;
                fStack_fcc = fStack_fd4;
                if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
                  local_f88 = ZEXT416((uint)(query->radius * query->radius));
                }
                else {
                  local_f88 = dpps(auVar28,auVar28,0x7f);
                }
                local_fa8 = CONCAT71((int7)(local_fa8 >> 8),1);
                local_100c = (undefined4)local_fa8;
                fStack_fb4 = local_fb8;
                fStack_fb0 = local_fb8;
                fStack_fac = local_fb8;
              }
            }
            break;
          }
          auVar28 = *(undefined1 (*) [16])(uVar13 + 0x60);
          auVar31 = *(undefined1 (*) [16])(uVar13 + 0x20);
          auVar30 = *(undefined1 (*) [16])(uVar13 + 0x30);
          auVar43 = *(undefined1 (*) [16])(uVar13 + 0x40);
          auVar44 = *(undefined1 (*) [16])(uVar13 + 0x50);
          auVar49 = *(undefined1 (*) [16])(uVar13 + 0x70);
          auVar42._4_4_ = fVar53;
          auVar42._0_4_ = fVar52;
          auVar42._8_4_ = fVar54;
          auVar42._12_4_ = fVar55;
          auVar42 = maxps(auVar42,auVar31);
          auVar42 = minps(auVar42,auVar30);
          fVar29 = auVar42._0_4_ - fVar52;
          fVar33 = auVar42._4_4_ - fVar53;
          fVar35 = auVar42._8_4_ - fVar54;
          fVar38 = auVar42._12_4_ - fVar55;
          auVar42 = maxps(auVar51,auVar43);
          auVar42 = minps(auVar42,auVar44);
          fVar40 = auVar42._0_4_ - fVar1;
          fVar45 = auVar42._4_4_ - fVar1;
          fVar46 = auVar42._8_4_ - fVar1;
          fVar47 = auVar42._12_4_ - fVar1;
          auVar42 = maxps(auVar50,auVar28);
          auVar42 = minps(auVar42,auVar49);
          fVar32 = auVar42._0_4_ - fVar2;
          fVar34 = auVar42._4_4_ - fVar2;
          fVar37 = auVar42._8_4_ - fVar2;
          fVar39 = auVar42._12_4_ - fVar2;
          local_fe8[0] = fVar32 * fVar32 + fVar40 * fVar40 + fVar29 * fVar29;
          local_fe8[1] = fVar34 * fVar34 + fVar45 * fVar45 + fVar33 * fVar33;
          local_fe8[2] = fVar37 * fVar37 + fVar46 * fVar46 + fVar35 * fVar35;
          local_fe8[3] = fVar39 * fVar39 + fVar47 * fVar47 + fVar38 * fVar38;
          bVar7 = ((auVar28._0_4_ <= fVar2 + local_fd8 && fVar52 - local_fb8 <= auVar30._0_4_) &&
                  (auVar31._0_4_ <= fVar52 + local_fb8 && auVar43._0_4_ <= fVar1 + local_fc8)) &&
                  (fVar2 - local_fd8 <= auVar49._0_4_ &&
                  (auVar31._0_4_ <= auVar30._0_4_ && fVar1 - local_fc8 <= auVar44._0_4_));
          bVar8 = ((auVar28._4_4_ <= fVar2 + fStack_fd4 && fVar53 - fStack_fb4 <= auVar30._4_4_) &&
                  (auVar31._4_4_ <= fVar53 + fStack_fb4 && auVar43._4_4_ <= fVar1 + fStack_fc4)) &&
                  (fVar2 - fStack_fd4 <= auVar49._4_4_ &&
                  (auVar31._4_4_ <= auVar30._4_4_ && fVar1 - fStack_fc4 <= auVar44._4_4_));
          bVar6 = ((auVar28._8_4_ <= fVar2 + fStack_fd0 && fVar54 - fStack_fb0 <= auVar30._8_4_) &&
                  (auVar31._8_4_ <= fVar54 + fStack_fb0 && auVar43._8_4_ <= fVar1 + fStack_fc0)) &&
                  (fVar2 - fStack_fd0 <= auVar49._8_4_ &&
                  (auVar31._8_4_ <= auVar30._8_4_ && fVar1 - fStack_fc0 <= auVar44._8_4_));
          bVar11 = ((auVar28._12_4_ <= fVar2 + fStack_fcc && fVar55 - fStack_fac <= auVar30._12_4_)
                   && (auVar31._12_4_ <= fVar55 + fStack_fac && auVar43._12_4_ <= fVar1 + fStack_fbc
                      )) && (fVar2 - fStack_fcc <= auVar49._12_4_ &&
                            (auVar31._12_4_ <= auVar30._12_4_ &&
                            fVar1 - fStack_fbc <= auVar44._12_4_));
        }
        auVar28._0_4_ = (uint)bVar7 * -0x80000000;
        auVar28._4_4_ = (uint)bVar8 * -0x80000000;
        auVar28._8_4_ = (uint)bVar6 * -0x80000000;
        auVar28._12_4_ = (uint)bVar11 * -0x80000000;
        uVar12 = movmskps((int)local_fa8,auVar28);
        local_fa8 = (ulong)uVar12;
        if (uVar12 != 0) {
          uVar14 = uVar13 & 0xfffffffffffffff0;
          lVar5 = 0;
          if ((byte)uVar12 != 0) {
            for (; ((byte)uVar12 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
            }
          }
          local_fa8 = *(ulong *)(uVar14 + lVar5 * 8);
          uVar12 = (uVar12 & 0xff) - 1 & uVar12 & 0xff;
          uVar13 = local_fa8;
          if (uVar12 != 0) {
            fVar29 = local_fe8[lVar5];
            lVar5 = 0;
            if (uVar12 != 0) {
              for (; (uVar12 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
              }
            }
            uVar13 = *(ulong *)(uVar14 + lVar5 * 8);
            fVar32 = local_fe8[lVar5];
            uVar12 = uVar12 - 1 & uVar12;
            if (uVar12 == 0) {
              if ((uint)fVar29 < (uint)fVar32) {
                *(ulong *)*pauVar16 = uVar13;
                *(float *)((long)*pauVar16 + 8) = fVar32;
                uVar13 = local_fa8;
                pauVar16 = pauVar16 + 1;
              }
              else {
                *(ulong *)*pauVar16 = local_fa8;
                *(float *)((long)*pauVar16 + 8) = fVar29;
                local_fa8 = uVar13;
                pauVar16 = pauVar16 + 1;
              }
            }
            else {
              auVar31._8_4_ = fVar29;
              auVar31._0_8_ = local_fa8;
              auVar31._12_4_ = 0;
              auVar43._8_4_ = fVar32;
              auVar43._0_8_ = uVar13;
              auVar43._12_4_ = 0;
              lVar5 = 0;
              if (uVar12 != 0) {
                for (; (uVar12 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
                }
              }
              uVar4 = *(undefined8 *)(uVar14 + lVar5 * 8);
              fVar33 = local_fe8[lVar5];
              auVar49._8_4_ = fVar33;
              auVar49._0_8_ = uVar4;
              auVar49._12_4_ = 0;
              auVar44._8_4_ = -(uint)((int)fVar29 < (int)fVar32);
              uVar12 = uVar12 - 1 & uVar12;
              if (uVar12 == 0) {
                auVar44._4_4_ = auVar44._8_4_;
                auVar44._0_4_ = auVar44._8_4_;
                auVar44._12_4_ = auVar44._8_4_;
                auVar41._8_4_ = fVar32;
                auVar41._0_8_ = uVar13;
                auVar41._12_4_ = 0;
                auVar42 = blendvps(auVar41,auVar31,auVar44);
                auVar28 = blendvps(auVar31,auVar43,auVar44);
                auVar17._8_4_ = -(uint)(auVar42._8_4_ < (int)fVar33);
                auVar17._4_4_ = auVar17._8_4_;
                auVar17._0_4_ = auVar17._8_4_;
                auVar17._12_4_ = auVar17._8_4_;
                auVar36._8_4_ = fVar33;
                auVar36._0_8_ = uVar4;
                auVar36._12_4_ = 0;
                auVar30 = blendvps(auVar36,auVar42,auVar17);
                auVar43 = blendvps(auVar42,auVar49,auVar17);
                auVar18._8_4_ = -(uint)(auVar28._8_4_ < auVar43._8_4_);
                auVar18._4_4_ = auVar18._8_4_;
                auVar18._0_4_ = auVar18._8_4_;
                auVar18._12_4_ = auVar18._8_4_;
                auVar31 = blendvps(auVar43,auVar28,auVar18);
                auVar28 = blendvps(auVar28,auVar43,auVar18);
                *pauVar16 = auVar28;
                pauVar16[1] = auVar31;
                local_fa8 = auVar30._0_8_;
                pauVar16 = pauVar16 + 2;
                uVar13 = local_fa8;
              }
              else {
                lVar5 = 0;
                if (uVar12 != 0) {
                  for (; (uVar12 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
                  }
                }
                auVar19._4_4_ = auVar44._8_4_;
                auVar19._0_4_ = auVar44._8_4_;
                auVar19._8_4_ = auVar44._8_4_;
                auVar19._12_4_ = auVar44._8_4_;
                auVar44 = blendvps(auVar43,auVar31,auVar19);
                auVar28 = blendvps(auVar31,auVar43,auVar19);
                auVar48._8_4_ = local_fe8[lVar5];
                auVar48._0_8_ = *(undefined8 *)(uVar14 + lVar5 * 8);
                auVar48._12_4_ = 0;
                auVar20._8_4_ = -(uint)((int)fVar33 < (int)local_fe8[lVar5]);
                auVar20._4_4_ = auVar20._8_4_;
                auVar20._0_4_ = auVar20._8_4_;
                auVar20._12_4_ = auVar20._8_4_;
                auVar30 = blendvps(auVar48,auVar49,auVar20);
                auVar31 = blendvps(auVar49,auVar48,auVar20);
                auVar21._8_4_ = -(uint)(auVar28._8_4_ < auVar31._8_4_);
                auVar21._4_4_ = auVar21._8_4_;
                auVar21._0_4_ = auVar21._8_4_;
                auVar21._12_4_ = auVar21._8_4_;
                auVar49 = blendvps(auVar31,auVar28,auVar21);
                auVar28 = blendvps(auVar28,auVar31,auVar21);
                auVar22._8_4_ = -(uint)(auVar44._8_4_ < auVar30._8_4_);
                auVar22._4_4_ = auVar22._8_4_;
                auVar22._0_4_ = auVar22._8_4_;
                auVar22._12_4_ = auVar22._8_4_;
                auVar31 = blendvps(auVar30,auVar44,auVar22);
                auVar43 = blendvps(auVar44,auVar30,auVar22);
                auVar23._8_4_ = -(uint)(auVar43._8_4_ < auVar49._8_4_);
                auVar23._4_4_ = auVar23._8_4_;
                auVar23._0_4_ = auVar23._8_4_;
                auVar23._12_4_ = auVar23._8_4_;
                auVar30 = blendvps(auVar49,auVar43,auVar23);
                auVar43 = blendvps(auVar43,auVar49,auVar23);
                *pauVar16 = auVar28;
                pauVar16[1] = auVar43;
                pauVar16[2] = auVar30;
                local_fa8 = auVar31._0_8_;
                pauVar16 = pauVar16 + 3;
                uVar13 = local_fa8;
              }
            }
          }
          goto LAB_00da686b;
        }
        if (pauVar16 == (undefined1 (*) [16])&local_f78) {
          return local_100c._0_1_;
        }
      }
      fVar24 = local_fb8 * local_fb8;
      fVar25 = fStack_fb4 * fStack_fb4;
      fVar26 = fStack_fb0 * fStack_fb0;
      fVar27 = fStack_fac * fStack_fac;
      uVar13 = local_fa8;
    } while (pauVar16 != (undefined1 (*) [16])&local_f78);
  }
  return local_100c._0_1_;
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }